

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spritesheet.cc
# Opt level: O1

vector<Image,_std::allocator<Image>_> *
LoadCgaSpritesheet(vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,string *filename)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  ReadBinaryFile(&local_28,filename);
  anon_unknown.dwarf_a30e::LoadCgaSpritesheet(__return_storage_ptr__,&local_28);
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image> LoadCgaSpritesheet(std::string const& filename) {
  auto const data = ReadBinaryFile(filename);
  return LoadCgaSpritesheet(data);
}